

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::source_filename_formatter<spdlog::details::scoped_padder>::format
          (source_filename_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  bool bVar1;
  memory_buf_t *dest_00;
  string_view_t view;
  size_t local_88;
  basic_string_view<char> local_68;
  undefined1 local_58 [8];
  scoped_padder p;
  size_t text_size;
  memory_buf_t *dest_local;
  tm *param_2_local;
  log_msg *msg_local;
  source_filename_formatter<spdlog::details::scoped_padder> *this_local;
  
  bVar1 = source_loc::empty(&msg->source);
  if (!bVar1) {
    bVar1 = padding_info::enabled(&(this->super_flag_formatter).padinfo_);
    if (bVar1) {
      local_88 = CLI::std::char_traits<char>::length((msg->source).filename);
    }
    else {
      local_88 = 0;
    }
    p.spaces_.size_ = local_88;
    dest_00 = dest;
    scoped_padder::scoped_padder
              ((scoped_padder *)local_58,local_88,&(this->super_flag_formatter).padinfo_,dest);
    ::fmt::v7::basic_string_view<char>::basic_string_view(&local_68,(msg->source).filename);
    view.size_ = (size_t)dest;
    view.data_ = (char *)local_68.size_;
    fmt_helper::append_string_view((fmt_helper *)local_68.data_,view,dest_00);
    scoped_padder::~scoped_padder((scoped_padder *)local_58);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        if (msg.source.empty())
        {
            return;
        }
        size_t text_size = padinfo_.enabled() ? std::char_traits<char>::length(msg.source.filename) : 0;
        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(msg.source.filename, dest);
    }